

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_GetGammas(ARKodeMem ark_mem,sunrealtype *gamma,sunrealtype *gamrat,int **jcur,
                     int *dgamma_fail)

{
  long lVar1;
  long *in_RCX;
  double *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  uint *in_R8;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    lVar1 = *(long *)(in_RDI + 0x88);
    *in_RSI = *(undefined8 *)(lVar1 + 0xa0);
    *in_RDX = *(double *)(lVar1 + 0xb0);
    *in_RCX = lVar1 + 0x110;
    *in_R8 = (uint)(*(double *)(lVar1 + 0xb8) <= ABS(*in_RDX - 1.0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_GetGammas(ARKodeMem ark_mem, sunrealtype* gamma, sunrealtype* gamrat,
                      sunbooleantype** jcur, sunbooleantype* dgamma_fail)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set outputs */
  step_mem     = (ARKodeARKStepMem)ark_mem->step_mem;
  *gamma       = step_mem->gamma;
  *gamrat      = step_mem->gamrat;
  *jcur        = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return (ARK_SUCCESS);
}